

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_case.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::caseMap
          (UnicodeString *this,int32_t caseLocale,uint32_t options,BreakIterator *iter,
          UStringCaseMapper *stringCaseMapper)

{
  ushort uVar1;
  UBool UVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  uint unaff_EBP;
  char16_t *src;
  int count;
  bool bVar5;
  UErrorCode errorCode;
  UStringCaseMapper *local_3e0;
  int32_t local_3d8;
  uint32_t local_3d4;
  char16_t *local_3d0;
  BreakIterator *local_3c8;
  ConstChar16Ptr local_3c0;
  ConstChar16Ptr local_3b8;
  UChar *local_3b0;
  char16_t *local_3a0;
  Iterator ei;
  UnicodeString oldString;
  Edits edits;
  UChar oldBuffer [54];
  int32_t *bufferToDelete;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) != 0 || uVar1 < 0x20) {
    return this;
  }
  if ((short)uVar1 < 0) {
    count = (this->fUnion).fFields.fLength;
  }
  else {
    count = (int)(short)uVar1 >> 5;
  }
  bVar5 = true;
  local_3d8 = caseLocale;
  local_3d4 = options;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 4) == 0) {
      bVar5 = false;
    }
    else {
      iVar3 = refCount(this);
      bVar5 = iVar3 != 1;
    }
  }
  errorCode = U_ZERO_ERROR;
  oldString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0;
  oldString.fUnion.fStackFields.fLengthAndFlags = 2;
  if (bVar5) {
    if (0x1a < count) {
LAB_002f2c21:
      if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        local_3d0 = (this->fUnion).fFields.fArray;
      }
      else {
        local_3d0 = (this->fUnion).fStackFields.fBuffer;
      }
      edits.array = edits.stackArray;
      edits.capacity = 100;
      edits.length = 0;
      edits.delta = 0;
      edits.numChanges = 0;
      edits.errorCode_ = U_ZERO_ERROR;
      if (iter != (BreakIterator *)0x0) {
        local_3c0.p_ = local_3d0;
        setTo(&oldString,'\0',&local_3c0,count);
        local_3a0 = local_3c0.p_;
        (*(iter->super_UObject)._vptr_UObject[7])(iter,&oldString);
      }
      (*stringCaseMapper)(local_3d8,local_3d4 | 0x4000,iter,(char16_t *)&bufferToDelete,200,
                          local_3d0,count,&edits,&errorCode);
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        unaff_EBP = edits.delta + count;
        if ((edits.delta < 1) ||
           (UVar2 = cloneArrayIfNeeded(this,unaff_EBP,unaff_EBP,'\x01',(int32_t **)0x0,'\0'),
           UVar2 != '\0')) {
          local_3e0 = stringCaseMapper;
          local_3c8 = iter;
          Edits::Iterator::Iterator(&ei,edits.array,edits.length,'\x01','\x01');
          while (UVar2 = Edits::Iterator::next(&ei,ei.onlyChanges_,&errorCode), UVar2 != '\0') {
            doReplace(this,ei.destIndex,ei.oldLength_,(UChar *)&bufferToDelete,ei.replIndex,
                      ei.newLength_);
          }
          if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            bVar5 = false;
            iter = local_3c8;
            stringCaseMapper = local_3e0;
            goto LAB_002f2f2a;
          }
          setToBogus(this);
          iter = local_3c8;
          stringCaseMapper = local_3e0;
        }
        bVar5 = false;
      }
      else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
        unaff_EBP = edits.delta + count;
        bVar5 = true;
      }
      else {
        setToBogus(this);
        bVar5 = false;
      }
LAB_002f2f2a:
      Edits::~Edits(&edits);
      goto joined_r0x002f2f16;
    }
  }
  else if (0x36 < count) goto LAB_002f2c21;
  pcVar4 = (this->fUnion).fStackFields.fBuffer;
  src = pcVar4;
  if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
    src = (this->fUnion).fFields.fArray;
  }
  local_3d0 = oldBuffer;
  local_3e0 = stringCaseMapper;
  u_memcpy_63(local_3d0,src,count);
  if (bVar5) {
    iVar3 = 0x1b;
    UVar2 = cloneArrayIfNeeded(this,0x1b,0x1b,'\0',(int32_t **)0x0,'\0');
    src = pcVar4;
    if (UVar2 != '\0') goto LAB_002f2d7b;
    bVar5 = false;
  }
  else {
    iVar3 = 0x1b;
    if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
        (undefined1  [56])0x0) {
      iVar3 = (this->fUnion).fFields.fCapacity;
    }
LAB_002f2d7b:
    if (iter != (BreakIterator *)0x0) {
      local_3b8.p_ = oldBuffer;
      setTo(&oldString,'\0',&local_3b8,count);
      local_3b0 = local_3b8.p_;
      (*(iter->super_UObject)._vptr_UObject[7])(iter,&oldString);
    }
    unaff_EBP = (*local_3e0)(local_3d8,local_3d4,iter,src,iVar3,oldBuffer,count,(Edits *)0x0,
                             &errorCode);
    pcVar4 = (char16_t *)(ulong)unaff_EBP;
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if ((int)unaff_EBP < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(unaff_EBP << 5) | uVar1 & 0x1f;
      }
      else {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
        (this->fUnion).fFields.fLength = unaff_EBP;
      }
      bVar5 = false;
      stringCaseMapper = local_3e0;
      goto joined_r0x002f2f16;
    }
    bVar5 = true;
    if (errorCode != U_BUFFER_OVERFLOW_ERROR) {
      setToBogus(this);
      bVar5 = false;
    }
  }
  unaff_EBP = (uint)pcVar4;
  stringCaseMapper = local_3e0;
joined_r0x002f2f16:
  if (bVar5) {
    bufferToDelete = (int32_t *)0x0;
    UVar2 = cloneArrayIfNeeded(this,unaff_EBP,unaff_EBP,'\0',&bufferToDelete,'\x01');
    if (UVar2 != '\0') {
      errorCode = U_ZERO_ERROR;
      bVar5 = ((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0;
      pcVar4 = (this->fUnion).fStackFields.fBuffer;
      if (bVar5) {
        pcVar4 = (this->fUnion).fFields.fArray;
      }
      iVar3 = 0x1b;
      if (bVar5) {
        iVar3 = (this->fUnion).fFields.fCapacity;
      }
      iVar3 = (*stringCaseMapper)(local_3d8,local_3d4,iter,pcVar4,iVar3,local_3d0,count,(Edits *)0x0
                                  ,&errorCode);
      if (bufferToDelete != (int32_t *)0x0) {
        uprv_free_63(bufferToDelete);
      }
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
        if (iVar3 < 0x400) {
          (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(iVar3 << 5) | uVar1 & 0x1f;
        }
        else {
          (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
          (this->fUnion).fFields.fLength = iVar3;
        }
      }
      else {
        setToBogus(this);
      }
    }
  }
  ~UnicodeString(&oldString);
  return this;
}

Assistant:

UnicodeString &
UnicodeString::caseMap(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
                       UStringCaseMapper *stringCaseMapper) {
  if(isEmpty() || !isWritable()) {
    // nothing to do
    return *this;
  }

  UChar oldBuffer[2 * US_STACKBUF_SIZE];
  UChar *oldArray;
  int32_t oldLength = length();
  int32_t newLength;
  UBool writable = isBufferWritable();
  UErrorCode errorCode = U_ZERO_ERROR;

#if !UCONFIG_NO_BREAK_ITERATION
  // Read-only alias to the original string contents for the titlecasing BreakIterator.
  // We cannot set the iterator simply to *this because *this is being modified.
  UnicodeString oldString;
#endif

  // Try to avoid heap-allocating a new character array for this string.
  if (writable ? oldLength <= UPRV_LENGTHOF(oldBuffer) : oldLength < US_STACKBUF_SIZE) {
    // Short string: Copy the contents into a temporary buffer and
    // case-map back into the current array, or into the stack buffer.
    UChar *buffer = getArrayStart();
    int32_t capacity;
    oldArray = oldBuffer;
    u_memcpy(oldBuffer, buffer, oldLength);
    if (writable) {
      capacity = getCapacity();
    } else {
      // Switch from the read-only alias or shared heap buffer to the stack buffer.
      if (!cloneArrayIfNeeded(US_STACKBUF_SIZE, US_STACKBUF_SIZE, /* doCopyArray= */ FALSE)) {
        return *this;
      }
      U_ASSERT(fUnion.fFields.fLengthAndFlags & kUsingStackBuffer);
      buffer = fUnion.fStackFields.fBuffer;
      capacity = US_STACKBUF_SIZE;
    }
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                 buffer, capacity,
                                 oldArray, oldLength, NULL, errorCode);
    if (U_SUCCESS(errorCode)) {
      setLength(newLength);
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
    } else {
      setToBogus();
      return *this;
    }
  } else {
    // Longer string or read-only buffer:
    // Collect only changes and then apply them to this string.
    // Case mapping often changes only small parts of a string,
    // and often does not change its length.
    oldArray = getArrayStart();
    Edits edits;
    UChar replacementChars[200];
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    stringCaseMapper(caseLocale, options | U_OMIT_UNCHANGED_TEXT, UCASEMAP_BREAK_ITERATOR
                     replacementChars, UPRV_LENGTHOF(replacementChars),
                     oldArray, oldLength, &edits, errorCode);
    if (U_SUCCESS(errorCode)) {
      // Grow the buffer at most once, not for multiple doReplace() calls.
      newLength = oldLength + edits.lengthDelta();
      if (newLength > oldLength && !cloneArrayIfNeeded(newLength, newLength)) {
        return *this;
      }
      for (Edits::Iterator ei = edits.getCoarseChangesIterator(); ei.next(errorCode);) {
        doReplace(ei.destinationIndex(), ei.oldLength(),
                  replacementChars, ei.replacementIndex(), ei.newLength());
      }
      if (U_FAILURE(errorCode)) {
        setToBogus();
      }
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
      newLength = oldLength + edits.lengthDelta();
    } else {
      setToBogus();
      return *this;
    }
  }

  // Handle buffer overflow, newLength is known.
  // We need to allocate a new buffer for the internal string case mapping function.
  // This is very similar to how doReplace() keeps the old array pointer
  // and deletes the old array itself after it is done.
  // In addition, we are forcing cloneArrayIfNeeded() to always allocate a new array.
  int32_t *bufferToDelete = 0;
  if (!cloneArrayIfNeeded(newLength, newLength, FALSE, &bufferToDelete, TRUE)) {
    return *this;
  }
  errorCode = U_ZERO_ERROR;
  // No need to iter->setText() again: The case mapper restarts via iter->first().
  newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                               getArrayStart(), getCapacity(),
                               oldArray, oldLength, NULL, errorCode);
  if (bufferToDelete) {
    uprv_free(bufferToDelete);
  }
  if (U_SUCCESS(errorCode)) {
    setLength(newLength);
  } else {
    setToBogus();
  }
  return *this;
}